

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioview.cpp
# Opt level: O3

void __thiscall FSSAudioView::setAudioData(FSSAudioView *this,PBuffer *data,QString *format)

{
  element_type *peVar1;
  size_t sVar2;
  int *piVar3;
  Data *pDVar4;
  char cVar5;
  QTemporaryFile *this_00;
  size_t sVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QString t;
  QString local_88;
  QString local_70;
  QArrayData *local_58;
  char16_t *local_50;
  qsizetype qStack_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined8 uStack_34;
  undefined4 local_2c;
  char *local_28;
  
  if (this->file != (QTemporaryFile *)0x0) {
    (**(code **)(*(long *)this->file + 0x20))();
    this->file = (QTemporaryFile *)0x0;
  }
  QWidget::setEnabled(SUB81(this->buttonPlay,0));
  QWidget::setEnabled(SUB81(this->slider,0));
  if ((data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr != (element_type *)0x0)
  {
    this_00 = (QTemporaryFile *)operator_new(0x10);
    QDir::tempPath();
    local_70.d.d = (Data *)local_58;
    local_70.d.ptr = local_50;
    local_70.d.size = qStack_48;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar7.m_data = (storage_type *)0x8;
    QVar7.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar7);
    QString::append(&local_70);
    piVar3 = (int *)CONCAT44(uStack_3c,local_40);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_3c,local_40),2,8);
      }
    }
    local_88.d.d = local_70.d.d;
    local_88.d.ptr = local_70.d.ptr;
    local_88.d.size = local_70.d.size;
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_88);
    QTemporaryFile::QTemporaryFile(this_00,&local_88);
    this->file = this_00;
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,8);
      }
    }
    cVar5 = (**(code **)(*(long *)this->file + 0x68))(this->file,3);
    if (cVar5 == '\0') {
      local_40 = 2;
      uStack_3c = 0;
      uStack_38 = 0;
      uStack_34 = 0;
      local_2c = 0;
      local_28 = "default";
      QMessageLogger::debug();
      pDVar4 = local_70.d.d;
      QVar8.m_data = (storage_type *)0x1d;
      QVar8.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)pDVar4,&local_88);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
        }
      }
      if ((char)local_70.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_70.d.d,' ');
      }
    }
    else {
      peVar1 = (data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      sVar2 = peVar1->size;
      sVar6 = QIODevice::write((char *)this->file,(longlong)peVar1->data);
      if (sVar6 == sVar2) {
        (**(code **)(*(long *)this->file + 0x70))();
        return;
      }
      local_40 = 2;
      uStack_3c = 0;
      uStack_38 = 0;
      uStack_34 = 0;
      local_2c = 0;
      local_28 = "default";
      QMessageLogger::debug();
      pDVar4 = local_70.d.d;
      QVar9.m_data = (storage_type *)0x21;
      QVar9.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)pDVar4,&local_88);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
        }
      }
      if ((char)local_70.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_70.d.d,' ');
      }
    }
    QDebug::~QDebug((QDebug *)&local_70);
  }
  return;
}

Assistant:

void
FSSAudioView::setAudioData(PBuffer data, const QString &format) {
  if (file != nullptr) {
    delete file;
    file = nullptr;
  }
  buttonPlay->setEnabled(false);
  slider->setEnabled(false);

  if (!data) {
    return;
  }

  file = new QTemporaryFile(QDir::tempPath() + "/XXXXXX." + format);
  if (!file->open()) {
    qDebug() << "Failed to open temporary file";
    return;
  }
  qint64 size = data->get_size();
  if (file->write((const char*)data->get_data(), size) != size) {
    qDebug() << "Failed to write to temporary file";
    return;
  }
  file->close();
}